

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_checkf(mpc_parser_t *a,mpc_dtor_t da,mpc_check_t f,char *fmt,...)

{
  char *__s;
  mpc_parser_t *pmVar1;
  char *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  mpc_parser_t *p;
  char *buffer;
  va_list va;
  char *in_stack_ffffffffffffff08;
  mpc_check_t in_stack_ffffffffffffff10;
  mpc_dtor_t in_stack_ffffffffffffff18;
  mpc_parser_t *in_stack_ffffffffffffff20;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_28 = &stack0xffffffffffffff08;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x20;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  __s = (char *)malloc(0x800);
  vsprintf(__s,local_20,&local_38);
  pmVar1 = mpc_check(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
  free(__s);
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_checkf(mpc_parser_t *a, mpc_dtor_t da, mpc_check_t f, const char *fmt, ...) {
  va_list va;
  char *buffer;
  mpc_parser_t *p;

  va_start(va, fmt);
  buffer = malloc(2048);
  vsprintf(buffer, fmt, va);
  va_end(va);

  p = mpc_check(a, da, f, buffer);
  free(buffer);

  return p;
}